

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O2

bool __thiscall FSpotList::Add(FSpotList *this,ASpecialSpot *newspot)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ASpecialSpot *local_18;
  
  uVar3 = (ulong)(this->Spots).Count;
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar3 == uVar2) {
      local_18 = newspot;
      TArray<ASpecialSpot_*,_ASpecialSpot_*>::Push(&this->Spots,&local_18);
      break;
    }
    uVar1 = uVar2 + 1;
  } while ((this->Spots).Array[uVar2] != newspot);
  return uVar3 <= uVar2;
}

Assistant:

bool Add(ASpecialSpot *newspot)
	{
		for(unsigned i = 0; i < Spots.Size(); i++)
		{
			if (Spots[i] == newspot) return false;
		}
		Spots.Push(newspot);
		return true;
	}